

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r2rect.cc
# Opt level: O3

ostream * operator<<(ostream *os,R2Rect *r)

{
  ostream *poVar1;
  D local_30;
  D local_20;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[Lo",3);
  local_20.c_[0] = r->bounds_[0].bounds_.c_[0];
  local_20.c_[1] = r->bounds_[1].bounds_.c_[0];
  poVar1 = util::math::internal_vector::operator<<(os,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", Hi",4);
  local_30.c_[0] = r->bounds_[0].bounds_.c_[1];
  local_30.c_[1] = r->bounds_[1].bounds_.c_[1];
  poVar1 = util::math::internal_vector::operator<<(poVar1,&local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const R2Rect& r) {
  return os << "[Lo" << r.lo() << ", Hi" << r.hi() << "]";
}